

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrbuf.cpp
# Opt level: O1

void __thiscall
CVmObjStringBuffer::restore_from_file
          (CVmObjStringBuffer *this,vm_obj_id_t self,CVmFile *fp,CVmObjFixup *fixups)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  int iVar5;
  ulong uVar6;
  int *piVar7;
  char buf [512];
  ulong local_238;
  uint local_230;
  
  if ((this->super_CVmObject).ext_ != (char *)0x0) {
    (*G_mem_X->varheap_->_vptr_CVmVarHeap[6])();
  }
  CVmFile::read_bytes(fp,(char *)&local_238,0xc);
  iVar1 = (*G_mem_X->varheap_->_vptr_CVmVarHeap[4])
                    (G_mem_X->varheap_,(long)((int)local_238 * 4 + 0xc),this);
  piVar7 = (int *)CONCAT44(extraout_var,iVar1);
  *(ulong *)(piVar7 + 1) = local_238;
  *piVar7 = 0;
  (this->super_CVmObject).ext_ = (char *)piVar7;
  uVar6 = (ulong)local_230;
  if ((int)local_238 <= (int)local_230) {
    uVar6 = local_238 & 0xffffffff;
  }
  *piVar7 = (int)uVar6;
  if ((int)uVar6 != 0) {
    piVar7 = piVar7 + 3;
    do {
      iVar5 = (int)uVar6;
      iVar1 = 0x100;
      if (iVar5 < 0x100) {
        iVar1 = iVar5;
      }
      CVmFile::read_bytes(fp,(char *)&local_238,(long)iVar1 * 2);
      iVar2 = iVar5;
      if (0xff < iVar5) {
        iVar2 = 0x100;
      }
      lVar3 = 0;
      lVar4 = 0;
      do {
        piVar7[lVar4] = (uint)*(ushort *)((long)&local_238 + lVar4 * 2);
        lVar4 = lVar4 + 1;
        lVar3 = lVar3 + -4;
      } while (iVar2 != (int)lVar4);
      piVar7 = (int *)((long)piVar7 - lVar3);
      uVar6 = (ulong)(uint)(iVar5 - iVar1);
    } while (iVar5 - iVar1 != 0);
  }
  return;
}

Assistant:

void CVmObjStringBuffer::restore_from_file(VMG_ vm_obj_id_t self,
                                           CVmFile *fp, CVmObjFixup *fixups)
{
    const int32_t bufchars = 256;
    char buf[bufchars * sizeof(uint16_t)];
    
    /* free our existing extension, if we have one */
    if (ext_ != 0)
        G_mem->get_var_heap()->free_mem(ext_);

    /* read the fixed fields */
    fp->read_bytes(buf, 12);
    int32_t alo = vmb_get_int4(buf);
    int32_t inc = vmb_get_int4(buf + 4);
    int32_t len = vmb_get_int4(buf + 8);

    /* allocate the extension structure */
    vm_strbuf_ext *ext = vm_strbuf_ext::alloc_ext(vmg_ this, alo, inc);
    ext_ = (char *)ext;

    /* limit the length */
    if (len > alo)
        len = alo;

    /* store it in the extension */
    ext->len = len;

    /* read the string contents */
    wchar_t *dst;
    int32_t rem;
    for (dst = ext->buf, rem = len ; rem != 0 ; )
    {
        /* read one buffer-full, or 'rem', whichever is less */
        int32_t cur = rem > bufchars ? bufchars : rem;
        fp->read_bytes(buf, cur * sizeof(uint16_t));

        /* deduct this read from the total */
        rem -= cur;

        /* decode the characters */
        for (const char *src = buf ; cur != 0 ;
             *dst++ = osrp2(src), src += 2, --cur) ;
    }
}